

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer pMVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  int iVar8;
  int iVar9;
  pointer mat;
  pointer pMVar10;
  double dVar11;
  double dVar12;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  allocator local_d1;
  vector<cv::Mat,_std::allocator<cv::Mat>_> bads;
  vector<cv::Mat,_std::allocator<cv::Mat>_> goods;
  timer t;
  classifier classifier;
  
  std::__cxx11::string::string((string *)&t,"../armor",(allocator *)&goods);
  sp::template_classifier::template_classifier(&classifier,(string *)&t);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../data/positive",(allocator *)&bads);
  get_test_src(&goods,(string *)&t);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string((string *)&t,"../data/negative",&local_d1);
  get_test_src(&bads,(string *)&t);
  std::__cxx11::string::~string((string *)&t);
  lVar5 = (long)goods.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)goods.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = (long)bads.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bads.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
  t.t.__d.__r = (time_point)std::chrono::_V2::system_clock::now();
  pMVar10 = goods.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar8 = 0;
  for (mat = goods.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
      pMVar3 = bads.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
               super__Vector_impl_data._M_finish, mat != pMVar10; mat = mat + 0x60) {
    bVar4 = sp::template_classifier::boolean_forward(&classifier,mat);
    iVar8 = iVar8 + (uint)bVar4;
  }
  iVar9 = 0;
  for (pMVar10 = bads.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start; pMVar10 != pMVar3; pMVar10 = pMVar10 + 0x60) {
    bVar4 = sp::template_classifier::boolean_forward(&classifier,pMVar10);
    iVar9 = iVar9 + (uint)!bVar4;
  }
  std::operator<<((ostream *)&std::cout,"Average bench time: ");
  dVar11 = timer::milli_cnt(&t);
  dVar12 = (double)((int)(lVar6 / 0x60) + (int)(lVar5 / 0x60));
  poVar7 = std::ostream::_M_insert<double>(dVar11 / dVar12);
  std::operator<<(poVar7," ms\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"goods right: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar8);
  poVar7 = std::operator<<(poVar7," / ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7," ~ ");
  auVar1._8_8_ = in_XMM2_Qb;
  auVar1._0_8_ = in_XMM2_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar1,((long)goods.
                                            super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)goods.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start) / 0x60);
  poVar7 = std::ostream::_M_insert<double>(((double)iVar8 * 100.0) / auVar1._0_8_);
  std::operator<<(poVar7," %\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"bads  right: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
  poVar7 = std::operator<<(poVar7," / ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7," ~ ");
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = in_XMM2_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar2,((long)bads.
                                            super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)bads.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start) / 0x60);
  poVar7 = std::ostream::_M_insert<double>(((double)iVar9 * 100.0) / auVar1._0_8_);
  std::operator<<(poVar7," %\n");
  std::operator<<((ostream *)&std::cout,"Total accuracy: ");
  poVar7 = std::ostream::_M_insert<double>(((double)(iVar9 + iVar8) * 100.0) / dVar12);
  std::operator<<(poVar7," %\n");
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&bads);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&goods);
  sp::template_classifier::~template_classifier(&classifier);
  return 0;
}

Assistant:

int main()
{
	sp::classifier classifier("../armor");
	// classifier.debug_prepared_show(cv::imread("../armor/positive/T2.png", cv::IMREAD_GRAYSCALE));
	// cv::waitKey();
	auto goods = get_test_src("../data/positive");
	auto bads  = get_test_src("../data/negative");

	int total = goods.size() + bads.size();
	int goods_right = 0;
	int bads_right  = 0;

	// @@@ test time.
	timer t;

	for(auto&& x : goods)
		goods_right += classifier.boolean_forward(x);
	for(auto&& x : bads )
		bads_right  += !classifier.boolean_forward(x);

	std::cout << "Average bench time: " << t.milli_cnt() / total << " ms\n";

	std::cout << "goods right: " << goods_right << " / " << goods.size() << " ~ " << static_cast<double>(goods_right) / goods.size() * 100 << " %\n";
	std::cout << "bads  right: " << bads_right  << " / " << bads.size()  << " ~ " << static_cast<double>(bads_right )  / bads.size() * 100<< " %\n";
	std::cout << "Total accuracy: " << static_cast<double>(goods_right + bads_right) / total * 100 << " %\n";

}